

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog>::operator()
          (RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  TransformerLogLog *pTVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImPlotPoint local_60;
  float local_50;
  float fStack_4c;
  ImVec2 P2;
  float local_34;
  float fStack_30;
  ImVec2 P1;
  int prim_local;
  ImVec2 *uv_local;
  ImRect *param_2_local;
  ImDrawList *DrawList_local;
  RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog> *this_local;
  
  pTVar1 = this->Transformer;
  _P2 = GetterXsYs<double>::operator()(this->Getter,prim * 2);
  IVar2 = TransformerLogLog::operator()(pTVar1,(ImPlotPoint *)&P2);
  pTVar1 = this->Transformer;
  local_60 = GetterXsYs<double>::operator()(this->Getter,prim * 2 + 1);
  IVar3 = TransformerLogLog::operator()(pTVar1,&local_60);
  DrawList->_VtxWritePtr->pos = IVar2;
  DrawList->_VtxWritePtr->uv = *uv;
  DrawList->_VtxWritePtr->col = this->Col;
  local_34 = IVar2.x;
  DrawList->_VtxWritePtr[1].pos.x = local_34;
  fStack_4c = IVar3.y;
  DrawList->_VtxWritePtr[1].pos.y = fStack_4c;
  DrawList->_VtxWritePtr[1].uv = *uv;
  DrawList->_VtxWritePtr[1].col = this->Col;
  DrawList->_VtxWritePtr[2].pos = IVar3;
  DrawList->_VtxWritePtr[2].uv = *uv;
  DrawList->_VtxWritePtr[2].col = this->Col;
  local_50 = IVar3.x;
  DrawList->_VtxWritePtr[3].pos.x = local_50;
  fStack_30 = IVar2.y;
  DrawList->_VtxWritePtr[3].pos.y = fStack_30;
  DrawList->_VtxWritePtr[3].uv = *uv;
  DrawList->_VtxWritePtr[3].col = this->Col;
  DrawList->_VtxWritePtr = DrawList->_VtxWritePtr + 4;
  *DrawList->_IdxWritePtr = DrawList->_VtxCurrentIdx;
  DrawList->_IdxWritePtr[1] = DrawList->_VtxCurrentIdx + 1;
  DrawList->_IdxWritePtr[2] = DrawList->_VtxCurrentIdx + 3;
  DrawList->_IdxWritePtr[3] = DrawList->_VtxCurrentIdx + 1;
  DrawList->_IdxWritePtr[4] = DrawList->_VtxCurrentIdx + 2;
  DrawList->_IdxWritePtr[5] = DrawList->_VtxCurrentIdx + 3;
  DrawList->_IdxWritePtr = DrawList->_IdxWritePtr + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P1 = Transformer(Getter(2*prim));
        ImVec2 P2 = Transformer(Getter(2*prim+1));
        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = Col;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = Col;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = Col;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = Col;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }